

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_instance.cpp
# Opt level: O0

void __thiscall
LoaderInstance::LoaderInstance
          (LoaderInstance *this,XrInstance instance,XrInstanceCreateInfo *create_info,
          PFN_xrGetInstanceProcAddr topmost_gipa,
          vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
          *api_layer_interfaces)

{
  char *pcVar1;
  pointer pXVar2;
  allocator local_61;
  value_type local_60;
  uint local_40;
  uint32_t ext;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  *local_30;
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  *api_layer_interfaces_local;
  PFN_xrGetInstanceProcAddr topmost_gipa_local;
  XrInstanceCreateInfo *create_info_local;
  XrInstance instance_local;
  LoaderInstance *this_local;
  
  this->_vptr_LoaderInstance = (_func_int **)&PTR__LoaderInstance_001b1988;
  this->_runtime_instance = instance;
  this->_topmost_gipa = topmost_gipa;
  local_30 = api_layer_interfaces;
  api_layer_interfaces_local =
       (vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
        *)topmost_gipa;
  topmost_gipa_local = (PFN_xrGetInstanceProcAddr)create_info;
  create_info_local = (XrInstanceCreateInfo *)instance;
  instance_local = (XrInstance)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_enabled_extensions);
  std::
  vector<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>,_std::allocator<std::unique_ptr<ApiLayerInterface,_std::default_delete<ApiLayerInterface>_>_>_>
  ::vector(&this->_api_layer_interfaces,api_layer_interfaces);
  pXVar2 = (pointer)operator_new(0x1f8);
  memset(pXVar2,0,0x1f8);
  std::unique_ptr<XrGeneratedDispatchTableCore,std::default_delete<XrGeneratedDispatchTableCore>>::
  unique_ptr<std::default_delete<XrGeneratedDispatchTableCore>,void>
            ((unique_ptr<XrGeneratedDispatchTableCore,std::default_delete<XrGeneratedDispatchTableCore>>
              *)&this->_dispatch_table,pXVar2);
  this->_messenger = (XrDebugUtilsMessengerEXT)0x0;
  for (local_40 = 0; local_40 < *(uint *)(topmost_gipa_local + 0x138); local_40 = local_40 + 1) {
    pcVar1 = *(char **)(*(long *)(topmost_gipa_local + 0x140) + (ulong)local_40 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->_enabled_extensions,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
  }
  pXVar2 = std::
           unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
           ::get(&this->_dispatch_table);
  GeneratedXrPopulateDispatchTableCore
            (pXVar2,(XrInstance)create_info_local,
             (PFN_xrGetInstanceProcAddr)api_layer_interfaces_local);
  return;
}

Assistant:

LoaderInstance::LoaderInstance(XrInstance instance, const XrInstanceCreateInfo* create_info, PFN_xrGetInstanceProcAddr topmost_gipa,
                               std::vector<std::unique_ptr<ApiLayerInterface>> api_layer_interfaces)
    : _runtime_instance(instance),
      _topmost_gipa(topmost_gipa),
      _api_layer_interfaces(std::move(api_layer_interfaces)),
      _dispatch_table(new XrGeneratedDispatchTableCore{}) {
    for (uint32_t ext = 0; ext < create_info->enabledExtensionCount; ++ext) {
        _enabled_extensions.push_back(create_info->enabledExtensionNames[ext]);
    }

    GeneratedXrPopulateDispatchTableCore(_dispatch_table.get(), instance, topmost_gipa);
}